

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O0

void __thiscall
PKCS7Test_KernelModuleSigning_Test::TestBody(PKCS7Test_KernelModuleSigning_Test *this)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  BIO *pBVar4;
  X509 *pXVar5;
  EVP_PKEY *pEVar6;
  PKCS7 *pPVar7;
  char *pcVar8;
  char *in_R9;
  string local_2a8;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__1;
  Message local_180;
  string_view local_178;
  Bytes local_168;
  Bytes local_158;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  string expected;
  UniquePtr<uint8_t> pkcs7_storage;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  pointer puStack_e0;
  int pkcs7_len;
  uint8_t *pkcs7_bytes;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  UniquePtr<PKCS7> pkcs7;
  UniquePtr<BIO> data_bio;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<BIO> key_bio;
  UniquePtr<X509> cert;
  UniquePtr<BIO> cert_bio;
  undefined1 local_50 [8];
  string key_pem;
  string cert_pem;
  PKCS7Test_KernelModuleSigning_Test *this_local;
  
  GetTestData_abi_cxx11_((string *)((long)&key_pem.field_2 + 8),"crypto/pkcs7/test/sign_cert.pem");
  GetTestData_abi_cxx11_((string *)local_50,"crypto/pkcs7/test/sign_key.pem");
  pvVar3 = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  pBVar4 = BIO_new_mem_buf(pvVar3,iVar2);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&cert,(pointer)pBVar4);
  pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&cert);
  pXVar5 = PEM_read_bio_X509(pBVar4,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
  std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<x509_st,bssl::internal::Deleter> *)&key_bio,(pointer)pXVar5);
  pvVar3 = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  pBVar4 = BIO_new_mem_buf(pvVar3,iVar2);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&key,(pointer)pBVar4);
  pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&key);
  pEVar6 = PEM_read_bio_PrivateKey(pBVar4,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&data_bio,(pointer)pEVar6);
  pBVar4 = BIO_new_mem_buf("signed data",0xb);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&pkcs7,(pointer)pBVar4);
  pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&key_bio);
  pEVar6 = (EVP_PKEY *)
           std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&data_bio);
  pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&pkcs7);
  pPVar7 = PKCS7_sign(pXVar5,pEVar6,(stack_st_X509 *)0x0,pBVar4,0x1c2);
  std::unique_ptr<PKCS7,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<PKCS7,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pPVar7);
  testing::AssertionResult::AssertionResult<std::unique_ptr<PKCS7,bssl::internal::Deleter>>
            ((AssertionResult *)local_a0,
             (unique_ptr<PKCS7,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)local_a0,(AssertionResult *)"pkcs7","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x1d7,pcVar8);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message(&local_a8);
  }
  pkcs7_bytes._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (pkcs7_bytes._4_4_ == 0) {
    puStack_e0 = (pointer)0x0;
    pPVar7 = (PKCS7 *)std::unique_ptr<PKCS7,_bssl::internal::Deleter>::get
                                ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = i2d_PKCS7(pPVar7,&stack0xffffffffffffff20);
    local_fc = 0;
    testing::internal::CmpHelperGE<int,int>
              ((internal *)local_f8,"pkcs7_len","0",
               (int *)((long)&gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4),&local_fc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pkcs7_storage,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x1db,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pkcs7_storage,&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pkcs7_storage);
      testing::Message::~Message(&local_108);
    }
    pkcs7_bytes._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    if (pkcs7_bytes._4_4_ == 0) {
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                 (expected.field_2._M_local_buf + 8),puStack_e0);
      GetTestData_abi_cxx11_((string *)&gtest_ar_1.message_,"crypto/pkcs7/test/sign_sha256.p7s");
      Bytes::Bytes(&local_158,puStack_e0,
                   (long)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_);
      local_178 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&gtest_ar_1.message_);
      Bytes::Bytes(&local_168,local_178);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_148,"Bytes(pkcs7_bytes, pkcs7_len)","Bytes(expected)",&local_158,
                 &local_168);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e0,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_180)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&key_bio);
      pEVar6 = (EVP_PKEY *)
               std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&data_bio);
      pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&pkcs7);
      pPVar7 = PKCS7_sign(pXVar5,pEVar6,(stack_st_X509 *)0x0,pBVar4,0x182);
      local_199 = pPVar7 == (PKCS7 *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_198,&local_199,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_198,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x80 | 0x2)",
                   "true","false",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e5,pcVar8);
        testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&key_bio);
      pEVar6 = (EVP_PKEY *)
               std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&data_bio);
      pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&pkcs7);
      pPVar7 = PKCS7_sign(pXVar5,pEVar6,(stack_st_X509 *)0x0,pBVar4,0xc2);
      local_1e1 = pPVar7 == (PKCS7 *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_1e0,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x80 | 0x2 | 0x40)",
                   "true","false",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1e8,pcVar8);
        testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_1f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
      pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&key_bio);
      pEVar6 = (EVP_PKEY *)
               std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&data_bio);
      pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&pkcs7);
      pPVar7 = PKCS7_sign(pXVar5,pEVar6,(stack_st_X509 *)0x0,pBVar4,0x143);
      local_229 = pPVar7 == (PKCS7 *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_228,&local_229,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_228,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x1 | 0x2 | 0x40)"
                   ,"true","false",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1eb,pcVar8);
        testing::internal::AssertHelper::operator=(&local_240,&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_238);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
      pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&key_bio);
      pEVar6 = (EVP_PKEY *)
               std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&data_bio);
      pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&pkcs7);
      pPVar7 = PKCS7_sign(pXVar5,pEVar6,(stack_st_X509 *)0x0,pBVar4,0x1c0);
      local_271 = pPVar7 == (PKCS7 *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_270,&local_271,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_280);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2a8,(internal *)local_270,
                   (AssertionResult *)
                   "PKCS7_sign(cert.get(), key.get(), nullptr, data_bio.get(), 0x100 | 0x80 | 0x40)"
                   ,"true","false",in_R9);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_288,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x1ee,pcVar8);
        testing::internal::AssertHelper::operator=(&local_288,&local_280);
        testing::internal::AssertHelper::~AssertHelper(&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        testing::Message::~Message(&local_280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      ERR_clear_error();
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)((long)&expected.field_2 + 8)
                );
      pkcs7_bytes._4_4_ = 0;
    }
  }
  std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&pkcs7);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&data_bio);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&key);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&key_bio);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&cert);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(key_pem.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST(PKCS7Test, KernelModuleSigning) {
  // Sign a message with the same call that the Linux kernel's sign-file.c
  // makes.
  std::string cert_pem = GetTestData("crypto/pkcs7/test/sign_cert.pem");
  std::string key_pem = GetTestData("crypto/pkcs7/test/sign_key.pem");
  bssl::UniquePtr<BIO> cert_bio(
      BIO_new_mem_buf(cert_pem.data(), cert_pem.size()));
  bssl::UniquePtr<X509> cert(
      PEM_read_bio_X509(cert_bio.get(), nullptr, nullptr, nullptr));

  bssl::UniquePtr<BIO> key_bio(BIO_new_mem_buf(key_pem.data(), key_pem.size()));
  bssl::UniquePtr<EVP_PKEY> key(
      PEM_read_bio_PrivateKey(key_bio.get(), nullptr, nullptr, nullptr));

  static const char kSignedData[] = "signed data";
  bssl::UniquePtr<BIO> data_bio(
      BIO_new_mem_buf(kSignedData, sizeof(kSignedData) - 1));

  bssl::UniquePtr<PKCS7> pkcs7(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_NOCERTS | PKCS7_DETACHED));
  ASSERT_TRUE(pkcs7);

  uint8_t *pkcs7_bytes = nullptr;
  const int pkcs7_len = i2d_PKCS7(pkcs7.get(), &pkcs7_bytes);
  ASSERT_GE(pkcs7_len, 0);
  bssl::UniquePtr<uint8_t> pkcs7_storage(pkcs7_bytes);

  // RSA signatures are deterministic so the output should not change.
  std::string expected = GetTestData("crypto/pkcs7/test/sign_sha256.p7s");
  EXPECT_EQ(Bytes(pkcs7_bytes, pkcs7_len), Bytes(expected));

  // Other option combinations should fail.
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_NOCERTS));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_BINARY | PKCS7_NOCERTS | PKCS7_DETACHED));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_TEXT | PKCS7_NOCERTS | PKCS7_DETACHED));
  EXPECT_FALSE(
      PKCS7_sign(cert.get(), key.get(), /*certs=*/nullptr, data_bio.get(),
                 PKCS7_NOATTR | PKCS7_BINARY | PKCS7_DETACHED));

  ERR_clear_error();
}